

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::Instr::InsertRangeBefore(Instr *this,Instr *startInstr,Instr *endInstr)

{
  Instr *pIVar1;
  
  pIVar1 = this->m_prev;
  startInstr->m_prev = pIVar1;
  this->m_prev = endInstr;
  if (pIVar1 != (Instr *)0x0) {
    pIVar1->m_next = startInstr;
  }
  endInstr->m_next = this;
  return;
}

Assistant:

void
Instr::InsertRangeBefore(Instr *startInstr, Instr *endInstr)
{
    Instr * prevInstr = this->m_prev;

    startInstr->m_prev = prevInstr;
    this->m_prev = endInstr;

    if (prevInstr)
    {
        prevInstr->m_next = startInstr;
    }
    endInstr->m_next = this;
}